

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

int64_t __thiscall xmrig::DaemonClient::submit(DaemonClient *this,JobResult *result)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar2;
  size_t stackCapacity;
  SubmitResult *this_00;
  uint64_t seq;
  long in_RSI;
  DaemonClient *in_RDI;
  int __flags;
  Value params;
  Document doc;
  undefined4 in_stack_fffffffffffffec8;
  Type in_stack_fffffffffffffecc;
  String *in_stack_fffffffffffffed0;
  uint64_t actualDiff;
  uint64_t diff;
  String *in_stack_fffffffffffffee8;
  CrtAllocator *in_stack_fffffffffffffef0;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Number local_e0;
  Ch *pCStack_d8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_d0;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_c8;
  CrtAllocator *local_c0;
  CrtAllocator *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  Document *in_stack_ffffffffffffff60;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_98;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_88;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_78;
  long local_18;
  uint64_t local_8;
  
  local_18 = in_RSI;
  pGVar2 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)String::data(&in_RDI->m_blocktemplate);
  String::size(&in_RDI->m_blocktemplate);
  bVar1 = String::operator!=(in_stack_fffffffffffffed0,
                             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (bVar1) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    stackCapacity = local_18 + 0x24;
    allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)&in_RDI->m_blocktemplate;
    String::data((String *)allocator);
    Buffer::toHex((uint8_t *)in_stack_fffffffffffffed0,
                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),(char *)0x1ea4a1);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(pGVar2,(Type)((ulong)in_RDI >> 0x20),allocator,stackCapacity,
                      in_stack_fffffffffffffef0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    String::toJSON(in_stack_fffffffffffffee8);
    this_00 = (SubmitResult *)
              rapidjson::
              GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::GetAllocator(&local_78);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)in_stack_fffffffffffffed0,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x1ea514);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_98);
    JsonRequest::create(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff50,(Value *)in_stack_ffffffffffffff48);
    diff = *(uint64_t *)(local_18 + 0x28);
    actualDiff = BaseClient::m_sequence;
    seq = JobResult::actualDiff((JobResult *)0x1ea570);
    __flags = 0;
    SubmitResult::SubmitResult
              (this_00,seq,diff,actualDiff,(int64_t)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffecc);
    pGVar2 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              *)std::
                map<long,_xmrig::SubmitResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::SubmitResult>_>_>
                ::operator[]((map<long,_xmrig::SubmitResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::SubmitResult>_>_>
                              *)pGVar2,(key_type_conflict *)in_RDI);
    (pGVar2->stack_).stack_ = in_stack_ffffffffffffff50;
    (pGVar2->stack_).allocator_ = local_c0;
    (pGVar2->stack_).ownAllocator_ = in_stack_ffffffffffffff48;
    pGVar2->allocator_ = local_d0;
    pGVar2->ownAllocator_ = pMStack_c8;
    (pGVar2->
    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ).data_.n = local_e0;
    (pGVar2->
    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ).data_.s.str = pCStack_d8;
    send(in_RDI,3,kJsonRPC,(size_t)&local_78,__flags);
    local_8 = BaseClient::m_sequence;
    BaseClient::m_sequence = BaseClient::m_sequence + 1;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_88);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument(pGVar2);
  }
  return local_8;
}

Assistant:

int64_t xmrig::DaemonClient::submit(const JobResult &result)
{
    if (result.jobId != (m_blocktemplate.data() + m_blocktemplate.size() - 32)) {
        return -1;
    }

    Buffer::toHex(reinterpret_cast<const uint8_t *>(&result.nonce), 4, m_blocktemplate.data() + 78);

    using namespace rapidjson;
    Document doc(kObjectType);

    Value params(kArrayType);
    params.PushBack(m_blocktemplate.toJSON(), doc.GetAllocator());

    JsonRequest::create(doc, m_sequence, "submitblock", params);

    m_results[m_sequence] = SubmitResult(m_sequence, result.diff, result.actualDiff(), 0, result.backend);

    send(HTTP_POST, kJsonRPC, doc);

    return m_sequence++;
}